

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O3

void __thiscall duckdb::BlockHandle::~BlockHandle(BlockHandle *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  undefined4 extraout_var;
  EvictionQueue *pEVar4;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var5;
  
  this->unswizzled = (char *)0x0;
  _Var5._M_head_impl =
       (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  if ((_Var5._M_head_impl != (FileBuffer *)0x0) && (this->buffer_type != TINY_BUFFER)) {
    iVar3 = (*this->block_manager->buffer_manager->_vptr_BufferManager[0x1f])();
    pEVar4 = BufferPool::GetEvictionQueueForBlockHandle
                       ((BufferPool *)CONCAT44(extraout_var,iVar3),this);
    LOCK();
    (pEVar4->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
         (pEVar4->total_dead_nodes).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    _Var5._M_head_impl =
         (this->buffer).
         super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
         super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  }
  if ((_Var5._M_head_impl != (FileBuffer *)0x0) && ((this->state)._M_i == BLOCK_LOADED)) {
    _Var5._M_head_impl =
         (this->buffer).
         super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
         super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
    (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
    _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
    super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
    if (_Var5._M_head_impl != (FileBuffer *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_FileBuffer + 8))();
    }
    BufferPool::MemoryUsage::UpdateUsedMemory
              (&((this->memory_charge).pool)->memory_usage,(this->memory_charge).tag,
               -(this->memory_charge).size);
    (this->memory_charge).size = 0;
  }
  BlockManager::UnregisterBlock(this->block_manager,this);
  BufferPoolReservation::~BufferPoolReservation(&this->memory_charge);
  _Var5._M_head_impl =
       (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (FileBuffer *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_FileBuffer + 8))();
  }
  (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  p_Var2 = (this->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
           super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

BlockHandle::~BlockHandle() { // NOLINT: allow internal exceptions
	// being destroyed, so any unswizzled pointers are just binary junk now.
	unswizzled = nullptr;
	D_ASSERT(!buffer || buffer->GetBufferType() == buffer_type);
	if (buffer && buffer_type != FileBufferType::TINY_BUFFER) {
		// we kill the latest version in the eviction queue
		auto &buffer_manager = block_manager.buffer_manager;
		buffer_manager.GetBufferPool().IncrementDeadNodes(*this);
	}

	// no references remain to this block: erase
	if (buffer && state == BlockState::BLOCK_LOADED) {
		D_ASSERT(memory_charge.size > 0);
		// the block is still loaded in memory: erase it
		buffer.reset();
		memory_charge.Resize(0);
	} else {
		D_ASSERT(memory_charge.size == 0);
	}
	try {
		block_manager.UnregisterBlock(*this);
	} catch (...) {
	}
}